

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_obj.h
# Opt level: O2

char * parse_float(char *ptr,float *val)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  byte *pbVar5;
  ulong uVar6;
  double *pdVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  pbVar2 = (byte *)skip_whitespace(ptr);
  if (*pbVar2 == 0x2d) {
    pbVar2 = pbVar2 + 1;
    dVar8 = -1.0;
  }
  else {
    dVar8 = 1.0;
    if (*pbVar2 == 0x2b) {
      pbVar2 = pbVar2 + 1;
    }
  }
  dVar9 = 0.0;
  for (; bVar1 = *pbVar2, 0xf5 < (byte)(bVar1 - 0x3a); pbVar2 = pbVar2 + 1) {
    dVar9 = dVar9 * 10.0 + (double)(int)(bVar1 - 0x30);
  }
  uVar6 = (ulong)(bVar1 == 0x2e);
  pbVar3 = pbVar2 + uVar6;
  pbVar5 = pbVar2 + uVar6 + 2;
  pbVar2 = pbVar2 + uVar6;
  dVar11 = 1.0;
  dVar10 = 0.0;
  while( true ) {
    pbVar2 = pbVar2 + 1;
    bVar1 = *pbVar3;
    if ((byte)(bVar1 - 0x3a) < 0xf6) break;
    pbVar3 = pbVar3 + 1;
    dVar10 = dVar10 * 10.0 + (double)(int)(bVar1 - 0x30);
    dVar11 = dVar11 * 10.0;
    pbVar5 = pbVar5 + 1;
  }
  dVar9 = dVar9 + dVar10 / dVar11;
  if ((bVar1 & 0xdf) == 0x45) {
    if (pbVar3[1] == 0x2b) {
      pdVar7 = POWER_10_POS;
      pbVar3 = pbVar5;
    }
    else if (pbVar3[1] == 0x2d) {
      pdVar7 = POWER_10_NEG;
      pbVar3 = pbVar5;
    }
    else {
      pdVar7 = POWER_10_POS;
      pbVar3 = pbVar2;
    }
    uVar4 = 0;
    for (; 0xf5 < (byte)(*pbVar3 - 0x3a); pbVar3 = pbVar3 + 1) {
      uVar4 = (uVar4 * 10 + (uint)*pbVar3) - 0x30;
    }
    dVar10 = 0.0;
    if (uVar4 < 0x14) {
      dVar10 = pdVar7[uVar4];
    }
    dVar9 = dVar9 * dVar10;
  }
  *val = (float)(dVar8 * dVar9);
  return (char *)pbVar3;
}

Assistant:

static
const char* parse_float(const char* ptr, float* val)
{
   double        sign;
   double        num;
   double        fra;
   double        div;
   unsigned int  eval;
   const double* powers;


   ptr = skip_whitespace(ptr);

   switch (*ptr)
   {
   case '+':
       sign = 1.0;
       ptr++;
       break;

   case '-':
       sign = -1.0;
       ptr++;
       break;

   default:
       sign = 1.0;
       break;
   }


   num = 0.0;
   while (is_digit(*ptr))
       num = 10.0 * num + (double)(*ptr++ - '0');

   if (*ptr == '.')
       ptr++;

   fra = 0.0;
   div = 1.0;

   while (is_digit(*ptr))
   {
       fra  = 10.0 * fra + (double)(*ptr++ - '0');
       div *= 10.0;
   }

   num += fra / div;

   if (is_exponent(*ptr))
   {
       ptr++;

       switch (*ptr)
       {
       case '+':
           powers = POWER_10_POS;
           ptr++;
           break;

       case '-':
           powers = POWER_10_NEG;
           ptr++;
           break;

       default:
           powers = POWER_10_POS;
           break;
       }

       eval = 0;
       while (is_digit(*ptr))
           eval = 10 * eval + (*ptr++ - '0');

       num *= (eval >= MAX_POWER) ? 0.0 : powers[eval];
   }

   *val = (float)(sign * num);

   return ptr;
}